

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync.cpp
# Opt level: O1

bool __thiscall
bidfx_public_api::price::pixie::PriceSync::operator==(PriceSync *this,PriceSync *that)

{
  bool bVar1;
  
  if (this == that) {
    return true;
  }
  if ((((this->conflation_latency_ == that->conflation_latency_) &&
       (this->edition_ == that->edition_)) && (this->revision_ == that->revision_)) &&
     ((this->revision_time_ == that->revision_time_ && (this->size_ == that->size_)))) {
    bVar1 = tools::ByteBuffer::operator==(this->price_updates_buffer_,that->price_updates_buffer_);
    return bVar1;
  }
  return false;
}

Assistant:

bool PriceSync::operator==(const PriceSync& that) const
    {
        return this == &that ||
            (conflation_latency_ == that.conflation_latency_ &&
            edition_ == that.edition_ &&
            revision_ == that.revision_ &&
            revision_time_ == that.revision_time_ &&
            size_ == that.size_ &&
            price_updates_buffer_ == that.price_updates_buffer_);
    }